

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O3

void __thiscall
QDuplicateTracker<RowOrColumnDefinition,_32UL>::QDuplicateTracker
          (QDuplicateTracker<RowOrColumnDefinition,_32UL> *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  allocator_type local_38;
  key_equal local_29;
  QHasher<RowOrColumnDefinition> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = std::pmr::get_default_resource();
  *(code **)&this->res = log10;
  *(QDuplicateTracker<RowOrColumnDefinition,_32UL> **)&this->field_0x708 = this;
  *(undefined8 *)&this->field_0x710 = 0x700;
  *(undefined8 *)&this->field_0x718 = 0xa80;
  *(undefined8 *)&this->field_0x720 = uVar1;
  *(QDuplicateTracker<RowOrColumnDefinition,_32UL> **)&this->field_0x728 = this;
  *(undefined8 *)&this->field_0x730 = 0x700;
  *(undefined8 *)&this->field_0x738 = 0;
  local_38._M_resource = (memory_resource *)&this->res;
  local_28.storedSeed = (size_t)QHashSeed::globalSeed();
  std::
  _Hashtable<RowOrColumnDefinition,_RowOrColumnDefinition,_std::pmr::polymorphic_allocator<RowOrColumnDefinition>,_std::__detail::_Identity,_std::equal_to<RowOrColumnDefinition>,_QDuplicateTracker<RowOrColumnDefinition,_32UL>::QHasher<RowOrColumnDefinition>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->set)._M_h,0x20,&local_28,&local_29,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}